

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Var::move_linked_to(Var *this,Var *new_var)

{
  pointer psVar1;
  element_type *peVar2;
  VarConcat *this_00;
  long lVar3;
  Var *pVVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  shared_ptr<kratos::VarSlice> *slice;
  undefined4 extraout_var;
  pointer psVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var10;
  VarException *pVVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer psVar12;
  basic_string_view<char> bVar13;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  Var *local_b8;
  Var *local_b0;
  pointer local_a8;
  __weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  __weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  *local_90;
  string local_88;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  Var *local_40;
  allocator_type local_31;
  
  iVar5 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])(new_var);
  if ((Var *)CONCAT44(extraout_var,iVar5) != this) {
    iVar5 = (*(new_var->super_IRNode)._vptr_IRNode[7])(new_var);
    iVar6 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
    local_b0 = new_var;
    local_40 = this;
    if (iVar5 != iVar6) {
      pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
      uVar7 = (*(this->super_IRNode)._vptr_IRNode[7])(this);
      uVar8 = (*(new_var->super_IRNode)._vptr_IRNode[7])(new_var);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)uVar7;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar8;
      bVar13 = fmt::v7::to_string_view<char,_0>
                         (
                         "Try to move linked variable to a variable that doesn\'t match width. Need {0}, got {1}"
                         );
      format_str.data_ = (char *)bVar13.size_;
      format_str.size_ = 0x22;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar13.data_,format_str,args);
      local_b8 = local_40;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_b8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l,&local_31);
      VarException::VarException(pVVar11,&local_88,&local_68);
      __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (new_var->is_signed_ != this->is_signed_) {
      pVVar11 = (VarException *)__cxa_allocate_exception(0x10);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x21b77d;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x21b77d;
      if (this->is_signed_ != false) {
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x21b77f;
      }
      if (new_var->is_signed_ != false) {
        local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x21b77f;
      }
      bVar13 = fmt::v7::to_string_view<char,_0>
                         (
                         "Try to move linked variable to a variable that doesn\'t match sign. Need {0}, got {1}"
                         );
      format_str_00.data_ = (char *)bVar13.size_;
      format_str_00.size_ = 0xcc;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar13.data_,format_str_00,args_00);
      local_b8 = local_40;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_b8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l_00,&local_31);
      VarException::VarException(pVVar11,&local_88,&local_68);
      __cxa_throw(pVVar11,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar1 = (this->slices_).
             super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar9 = (this->slices_).
                  super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar1; psVar9 = psVar9 + 1)
    {
      ((psVar9->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      parent_var = new_var;
    }
    std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarSlice>*,std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>>,void>
              ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                *)&local_68,
               (this->slices_).
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->slices_).
               super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_88);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    _M_move_assign(&new_var->slices_,
                   (vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                    *)&local_68);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             *)&local_68);
    std::
    vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
    clear(&this->slices_);
    local_90 = &this->concat_vars_;
    local_a8 = (this->concat_vars_).
               super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_a0 = (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<kratos::Var>;
    local_98 = (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &new_var->super_enable_shared_from_this<kratos::Var>;
    for (psVar12 = (this->concat_vars_).
                   super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pVVar4 = local_40, psVar12 != local_a8
        ; psVar12 = psVar12 + 1) {
      peVar2 = (psVar12->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar2->super_Expr).super_Var.super_IRNode._vptr_IRNode[0x14])(peVar2,new_var);
      this_00 = (psVar12->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_68,local_a0);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_88,local_98);
      VarConcat::replace_var
                (this_00,(shared_ptr<kratos::Var> *)&local_68,(shared_ptr<kratos::Var> *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_68.
                  super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>::
    vector<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::VarConcat>*,std::vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>>,void>
              ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                *)&local_68,
               (local_40->concat_vars_).
               super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (local_40->concat_vars_).
               super__Vector_base<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_88);
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::_M_move_assign(&new_var->concat_vars_,
                     (vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                      *)&local_68);
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::~vector((vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
               *)&local_68);
    std::
    vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
    ::clear(local_90);
    for (p_Var10 = (pVVar4->casted_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(pVVar4->casted_)._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      lVar3 = *(long *)(p_Var10 + 1);
      iVar5 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])(new_var);
      *(ulong *)(lVar3 + 0x278) = CONCAT44(extraout_var_00,iVar5);
      iVar5 = (*(new_var->super_IRNode)._vptr_IRNode[0x29])(new_var);
      std::
      _Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
      ::_M_emplace_unique<std::shared_ptr<kratos::VarCasted>const&>
                ((_Rb_tree<std::shared_ptr<kratos::VarCasted>,std::shared_ptr<kratos::VarCasted>,std::_Identity<std::shared_ptr<kratos::VarCasted>>,std::less<std::shared_ptr<kratos::VarCasted>>,std::allocator<std::shared_ptr<kratos::VarCasted>>>
                  *)(CONCAT44(extraout_var_01,iVar5) + 0x208),
                 (shared_ptr<kratos::VarCasted> *)(p_Var10 + 1));
    }
    std::
    _Rb_tree<std::shared_ptr<kratos::VarCasted>,_std::shared_ptr<kratos::VarCasted>,_std::_Identity<std::shared_ptr<kratos::VarCasted>_>,_std::less<std::shared_ptr<kratos::VarCasted>_>,_std::allocator<std::shared_ptr<kratos::VarCasted>_>_>
    ::clear(&(local_40->casted_)._M_t);
  }
  return;
}

Assistant:

void Var::move_linked_to(kratos::Var *new_var) {
    if (this == new_var->get_var_root_parent()) return;
    // this one doesn't do much checking
    // user code code should check instead
    if (new_var->width() != width()) {
        throw VarException(::format("Try to move linked variable to a variable that "
                                    "doesn't match width. Need {0}, got {1}",
                                    width(), new_var->width()),
                           {this, new_var});
    }
    if (new_var->is_signed() != is_signed()) {
        throw VarException(::format("Try to move linked variable to a variable that "
                                    "doesn't match sign. Need {0}, got {1}",
                                    is_signed() ? "signed" : "unsigned",
                                    new_var->is_signed() ? "signed" : "unsigned"),
                           {this, new_var});
    }
    // move all references held in var to the new var
    // and change the parents
    for (auto &slice : slices_) {
        slice->set_parent(new_var);
    }
    new_var->slices_ = std::vector(slices_.begin(), slices_.end());
    slices_.clear();

    // change concat'ed vars
    // we use overloaded ones
    for (auto const &concat : concat_vars_) {
        concat->move_linked_to(new_var);
        concat->replace_var(shared_from_this(), new_var->shared_from_this());
    }
    new_var->concat_vars_ =
        std::vector<std::shared_ptr<VarConcat>>(concat_vars_.begin(), concat_vars_.end());
    concat_vars_.clear();

    // casted
    for (auto const &var : casted_) {
        var->set_parent(new_var->get_var_root_parent());
        new_var->get_var_root_parent()->casted_.emplace(var);
    }
    casted_.clear();
}